

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ModSystem.cpp
# Opt level: O0

void __thiscall
RenX_ModSystemPlugin::RenX_OnAdminLogout
          (RenX_ModSystemPlugin *this,Server *server,PlayerInfo *player)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  __sv_type _Var4;
  int local_9c;
  int local_2c;
  ModGroup *pMStack_28;
  int access;
  ModGroup *group;
  PlayerInfo *player_local;
  Server *server_local;
  RenX_ModSystemPlugin *this_local;
  
  pMStack_28 = (ModGroup *)0x0;
  sVar2 = std::__cxx11::
          list<RenX_ModSystemPlugin::ModGroup,_std::allocator<RenX_ModSystemPlugin::ModGroup>_>::
          size(&this->groups);
  if (sVar2 == 0) {
    local_9c = 0;
  }
  else {
    pvVar3 = std::__cxx11::
             list<RenX_ModSystemPlugin::ModGroup,_std::allocator<RenX_ModSystemPlugin::ModGroup>_>::
             front(&this->groups);
    local_9c = pvVar3->access;
  }
  local_2c = local_9c;
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&player->adminType);
  __x_00._M_str = "administrator";
  __x_00._M_len = 0xd;
  bVar1 = std::operator==(__x_00,_Var4);
  if (bVar1) {
    local_2c = 2;
    _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                      ((string *)&this->m_administratorGroup);
    pMStack_28 = getGroupByName(this,_Var4,(ModGroup *)0x0);
  }
  else {
    _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&player->adminType);
    __x._M_str = "moderator";
    __x._M_len = 9;
    bVar1 = std::operator==(__x,_Var4);
    if (bVar1) {
      local_2c = 1;
      _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                        ((string *)&this->m_moderatorGroup);
      pMStack_28 = getGroupByName(this,_Var4,(ModGroup *)0x0);
    }
  }
  if (pMStack_28 != (ModGroup *)0x0) {
    local_2c = pMStack_28->access;
  }
  if (player->access <= local_2c) {
    sVar2 = std::__cxx11::
            list<RenX_ModSystemPlugin::ModGroup,_std::allocator<RenX_ModSystemPlugin::ModGroup>_>::
            size(&this->groups);
    if (sVar2 == 0) {
      player->access = 0;
    }
    else {
      pvVar3 = std::__cxx11::
               list<RenX_ModSystemPlugin::ModGroup,_std::allocator<RenX_ModSystemPlugin::ModGroup>_>
               ::front(&this->groups);
      player->access = pvVar3->access;
    }
  }
  return;
}

Assistant:

void RenX_ModSystemPlugin::RenX_OnAdminLogout(RenX::Server &server, const RenX::PlayerInfo &player) {
	ModGroup *group = nullptr;
	int access = RenX_ModSystemPlugin::groups.size() == 0 ? 0 : RenX_ModSystemPlugin::groups.front().access;
	if (player.adminType == game_administrator_name)
	{
		access = 2;
		group = getGroupByName(m_administratorGroup);
	}
	else if (player.adminType == game_moderator_name)
	{
		access = 1;
		group = getGroupByName(m_moderatorGroup);
	}
	if (group != nullptr)
		access = group->access;

	if (player.access <= access)
	{
		if (RenX_ModSystemPlugin::groups.size() == 0)
			player.access = 0;
		else
			player.access = RenX_ModSystemPlugin::groups.front().access;
	}
}